

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::printHeaderString(ostream *os,string *_string,size_t indent)

{
  Column *pCVar1;
  ostream *poVar2;
  size_t in_RDX;
  char *in_RSI;
  Column *in_RDI;
  Column *in_stack_00000038;
  ostream *in_stack_00000040;
  size_t i;
  Column local_60;
  long local_20;
  size_t local_18;
  Column *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = std::__cxx11::string::find(in_RSI,0x233700);
  if (local_20 == -1) {
    local_20 = 0;
  }
  else {
    local_20 = local_20 + 2;
  }
  pCVar1 = &local_60;
  TextFlow::Column::Column(local_8,(string *)pCVar1);
  pCVar1 = TextFlow::Column::indent(pCVar1,local_18 + local_20);
  TextFlow::Column::initialIndent(pCVar1,local_18);
  poVar2 = TextFlow::operator<<(in_stack_00000040,in_stack_00000038);
  std::operator<<(poVar2,'\n');
  TextFlow::Column::~Column((Column *)0x1ad6a6);
  return;
}

Assistant:

void printHeaderString(std::ostream& os, std::string const& _string, std::size_t indent = 0) {
            std::size_t i = _string.find(": ");
            if (i != std::string::npos)
                i += 2;
            else
                i = 0;
            os << TextFlow::Column(_string)
                  .indent(indent + i)
                  .initialIndent(indent) << '\n';
        }